

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O3

void __thiscall
Assimp::IFCImporter::InternReadFile
          (IFCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  string *__rhs;
  size_type *psVar1;
  ObjectMapByType *this_00;
  pointer pcVar2;
  size_type sVar3;
  pointer pLVar4;
  undefined8 *puVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  _Alloc_hider _Var12;
  pointer __src;
  pointer __src_00;
  undefined4 uVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  undefined4 extraout_var;
  long lVar17;
  long lVar18;
  size_t sVar19;
  uint8_t *puVar20;
  MemoryIOStream *__p;
  DB *pDVar21;
  long *plVar22;
  const_iterator cVar23;
  IfcUnitAssignment *pIVar24;
  IfcRepresentationContext *pIVar25;
  void *pvVar26;
  Object *pOVar27;
  aiNode *paVar28;
  undefined8 *puVar29;
  _Base_ptr p_Var30;
  IfcObjectDefinition *pIVar31;
  aiNode *paVar32;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var33;
  IFCImporter *pIVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  char *pcVar36;
  aiNode **ppaVar37;
  aiMesh **__s;
  aiMaterial **__s_00;
  ulong *puVar38;
  _Base_ptr p_Var39;
  LazyObject *this_01;
  undefined8 uVar40;
  ulong uVar41;
  char **ppcVar42;
  pointer pLVar43;
  aiScene *paVar44;
  ulong uVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined4 in_XMM2_Db;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined4 in_XMM7_Db;
  float fVar62;
  float fVar63;
  undefined4 in_XMM9_Db;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar71;
  size_type __dnew;
  ConversionSchema schema;
  shared_ptr<Assimp::IOStream> stream;
  char filename [256];
  unz_file_info fileInfo;
  string local_510;
  aiScene *local_4f0;
  undefined8 *local_4e8;
  iterator iStack_4e0;
  aiNode **local_4d8;
  string local_4c8;
  undefined8 local_4a8;
  undefined8 local_498;
  DB *local_488;
  float local_47c;
  float local_478;
  float local_474;
  float local_470;
  float local_46c;
  float local_468;
  float local_464;
  float local_460;
  float local_45c;
  float local_458;
  float local_454;
  float local_450;
  float local_44c;
  float local_448;
  float local_444;
  float local_440;
  float local_43c;
  undefined1 local_438 [32];
  _Base_ptr local_418;
  size_t local_410;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  undefined8 local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  shared_ptr<Assimp::IOStream> local_3a8;
  undefined1 local_398 [112];
  double local_328;
  double dStack_320;
  double local_318;
  double local_310;
  double dStack_308;
  _func_int **local_300;
  _Base_bitset<1UL> _Stack_2f8;
  double local_2f0;
  pointer local_2e8;
  pointer ppaStack_2e0;
  pointer local_2d8;
  pointer ppaStack_2d0;
  pointer local_2c8;
  pointer ppaStack_2c0;
  _Rb_tree_node_base local_2b0;
  size_t local_290;
  _Rb_tree_node_base local_280;
  size_t local_260;
  Settings *local_258;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *local_250;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvStack_248;
  _Rb_tree_node_base local_238;
  size_t local_218;
  float local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [4];
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c0;
  undefined8 uStack_1b0;
  float local_1a8;
  undefined8 local_1a4;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  ios_base local_160 [264];
  float local_58;
  float local_48;
  
  pcVar2 = local_398 + 0x10;
  local_398._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"rb","");
  iVar15 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_398._0_8_);
  local_408._M_ptr = (element_type *)CONCAT44(extraout_var,iVar15);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_408._M_refcount,local_408._M_ptr);
  if ((pointer)local_398._0_8_ != pcVar2) {
    operator_delete((void *)local_398._0_8_);
  }
  if (local_408._M_ptr == (IOStream *)0x0) {
    local_398._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,"Could not open file for reading","");
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_398);
    if ((pointer)local_398._0_8_ != pcVar2) {
      operator_delete((void *)local_398._0_8_);
    }
  }
  BaseImporter::GetExtension((string *)local_398,pFile);
  iVar15 = std::__cxx11::string::compare(local_398);
  pcVar2 = local_398 + 0x10;
  if ((pointer)local_398._0_8_ != pcVar2) {
    operator_delete((void *)local_398._0_8_);
  }
  local_4f0 = pScene;
  if (iVar15 == 0) {
    lVar17 = unzOpen((pFile->_M_dataplus)._M_p);
    if (lVar17 == 0) {
      local_398._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_398,"Could not open ifczip file for reading, unzip failed","");
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_398);
      if ((pointer)local_398._0_8_ != pcVar2) {
        operator_delete((void *)local_398._0_8_);
      }
    }
    std::__cxx11::string::substr((ulong)local_438,(ulong)pFile);
    lVar18 = std::__cxx11::string::rfind((char)pFile,0x5c);
    if ((lVar18 != -1) || (lVar18 = std::__cxx11::string::rfind((char)pFile,0x2f), lVar18 != -1)) {
      std::__cxx11::string::substr((ulong)local_398,(ulong)local_438);
      std::__cxx11::string::operator=((string *)local_438,(string *)local_398);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_);
      }
    }
    iVar15 = unzGoToFirstFile(lVar17);
    if (iVar15 == 0) {
      local_498 = this;
      do {
        unzGetCurrentFileInfo(lVar17,local_1d0,local_398,0x100,0,0,0,0);
        local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        sVar19 = strlen(local_398);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4c8,local_398,local_398 + sVar19);
        BaseImporter::GetExtension(&local_510,&local_4c8);
        iVar15 = std::__cxx11::string::compare((char *)&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p);
        }
      } while (iVar15 != 0);
      puVar20 = (uint8_t *)operator_new__(CONCAT44(fStack_194,fStack_198));
      LogFunctions<Assimp::IFCImporter>::LogInfo((char *)0x4a69c7);
      unzOpenCurrentFile(lVar17);
      lVar18 = 0;
      while( true ) {
        uVar45 = CONCAT44(fStack_194,fStack_198);
        if (0x7ffe < uVar45) {
          uVar45 = 0x7fff;
        }
        pvVar26 = malloc(uVar45);
        uVar16 = unzReadCurrentFile(lVar17,pvVar26,uVar45 & 0xffffffff);
        if ((int)uVar16 < 1) break;
        memcpy(puVar20 + lVar18,pvVar26,(ulong)uVar16);
        lVar18 = lVar18 + (ulong)uVar16;
        free(pvVar26);
      }
      free(pvVar26);
      this = local_498;
      if ((lVar18 == 0) || (lVar18 != CONCAT44(fStack_194,fStack_198))) {
        operator_delete__(puVar20);
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_510,"Failed to decompress IFC ZIP file","");
        LogFunctions<Assimp::IFCImporter>::ThrowException(&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p);
        }
      }
      unzCloseCurrentFile(lVar17);
      __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
      (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_008e5418;
      __p->buffer = puVar20;
      __p->length = CONCAT44(fStack_194,fStack_198);
      __p->pos = 0;
      __p->own = true;
      std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
                (&local_408,__p);
      pScene = local_4f0;
    }
    else {
      local_398._0_8_ = local_398 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_398,"Found no IFC file member in IFCZIP file (2)","");
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_398);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_);
      }
    }
    unzClose(lVar17);
    if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
      operator_delete((void *)local_438._0_8_);
    }
  }
  local_3a8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_408._M_ptr;
  local_3a8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_408._M_refcount._M_pi;
  if (local_408._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_408._M_refcount._M_pi)->_M_use_count = (local_408._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_408._M_refcount._M_pi)->_M_use_count = (local_408._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pDVar21 = STEP::ReadFileHeader(&local_3a8);
  local_488 = pDVar21;
  if (local_3a8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  __rhs = &(pDVar21->header).fileSchema;
  if ((pDVar21->header).fileSchema._M_string_length == 0) {
LAB_004a6bb8:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                   "Unrecognized file schema: ",__rhs);
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_398,(ulong)__rhs);
    iVar15 = std::__cxx11::string::compare(local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_);
    }
    if (iVar15 != 0) goto LAB_004a6bb8;
  }
  bVar14 = DefaultLogger::isNullLogger();
  if (!bVar14) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                   "File schema is \'",__rhs);
    plVar22 = (long *)std::__cxx11::string::_M_replace_aux
                                ((ulong)local_438,CONCAT44(local_438._12_4_,local_438._8_4_),0,
                                 '\x01');
    paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar22 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar22 == paVar35) {
      sVar3 = paVar35->_M_allocated_capacity;
      lVar17 = plVar22[3];
      aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
      aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
      aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
      aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
      aStack_1c0._8_3_ = (undefined3)lVar17;
      aStack_1c0._M_local_buf[0xb] = (char)((ulong)lVar17 >> 0x18);
      aStack_1c0._12_4_ = (undefined4)((ulong)lVar17 >> 0x20);
      _local_1d0 = (pointer)&aStack_1c0;
    }
    else {
      sVar3 = paVar35->_M_allocated_capacity;
      aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
      aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
      aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
      aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
      _local_1d0 = (pointer)*plVar22;
    }
    fStack_1c8 = (float)plVar22[1];
    fStack_1c4 = (float)((ulong)plVar22[1] >> 0x20);
    *plVar22 = (long)paVar35;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_398,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_398);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    std::ios_base::~ios_base((ios_base *)&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0);
    }
    pcVar2 = local_438 + 0x10;
    if ((pointer)local_438._0_8_ != pcVar2) {
      operator_delete((void *)local_438._0_8_);
    }
    if ((pDVar21->header).timestamp._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                     "Timestamp \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pDVar21);
      plVar22 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_438,CONCAT44(local_438._12_4_,local_438._8_4_),0,
                                   '\x01');
      paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 == paVar35) {
        sVar3 = paVar35->_M_allocated_capacity;
        lVar17 = plVar22[3];
        aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
        aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
        aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
        aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
        aStack_1c0._8_3_ = (undefined3)lVar17;
        aStack_1c0._M_local_buf[0xb] = (char)((ulong)lVar17 >> 0x18);
        aStack_1c0._12_4_ = (undefined4)((ulong)lVar17 >> 0x20);
        _local_1d0 = (pointer)&aStack_1c0;
      }
      else {
        sVar3 = paVar35->_M_allocated_capacity;
        aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
        aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
        aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
        aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
        _local_1d0 = (pointer)*plVar22;
      }
      fStack_1c8 = (float)plVar22[1];
      fStack_1c4 = (float)((ulong)plVar22[1] >> 0x20);
      *plVar22 = (long)paVar35;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_398);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
      std::ios_base::~ios_base((ios_base *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1d0 != &aStack_1c0) {
        operator_delete(_local_1d0);
      }
      if ((pointer)local_438._0_8_ != pcVar2) {
        operator_delete((void *)local_438._0_8_);
      }
    }
    if ((pDVar21->header).app._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                     "Application/Exporter identline is \'",&(pDVar21->header).app);
      plVar22 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_438,CONCAT44(local_438._12_4_,local_438._8_4_),0,
                                   '\x01');
      paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 == paVar35) {
        sVar3 = paVar35->_M_allocated_capacity;
        lVar17 = plVar22[3];
        aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
        aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
        aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
        aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
        aStack_1c0._8_3_ = (undefined3)lVar17;
        aStack_1c0._M_local_buf[0xb] = (char)((ulong)lVar17 >> 0x18);
        aStack_1c0._12_4_ = (undefined4)((ulong)lVar17 >> 0x20);
        _local_1d0 = (pointer)&aStack_1c0;
      }
      else {
        sVar3 = paVar35->_M_allocated_capacity;
        aStack_1c0._M_allocated_capacity._0_4_ = (undefined4)sVar3;
        aStack_1c0._M_local_buf[4] = (char)(sVar3 >> 0x20);
        aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)(sVar3 >> 0x28);
        aStack_1c0._M_local_buf[7] = (char)(sVar3 >> 0x38);
        _local_1d0 = (pointer)*plVar22;
      }
      fStack_1c8 = (float)plVar22[1];
      fStack_1c4 = (float)((ulong)plVar22[1] >> 0x20);
      *plVar22 = (long)paVar35;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_398);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
      std::ios_base::~ios_base((ios_base *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1d0 != &aStack_1c0) {
        operator_delete(_local_1d0);
      }
      if ((pointer)local_438._0_8_ != pcVar2) {
        operator_delete((void *)local_438._0_8_);
      }
    }
  }
  local_438._24_8_ = local_438 + 8;
  local_438._8_4_ = _S_red;
  local_438._16_8_ = 0;
  local_410 = 0;
  local_418 = (_Base_ptr)local_438._24_8_;
  Assimp::IFC::Schema_2x3::GetSchema((ConversionSchema *)local_438);
  ppcVar42 = InternReadFile::inverse_indices_to_track;
  STEP::ReadFile(pDVar21,(ConversionSchema *)local_438,InternReadFile::types_to_track,3,
                 InternReadFile::inverse_indices_to_track,6);
  pcVar2 = local_398 + 0x10;
  local_398._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"ifcproject","");
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find(&(pDVar21->objects_bytype)._M_t,(key_type *)local_398);
  if (((_Rb_tree_header *)cVar23._M_node ==
       &(pDVar21->objects_bytype)._M_t._M_impl.super__Rb_tree_header) ||
     (cVar23._M_node[3]._M_parent == (_Base_ptr)0x0)) {
    this_01 = (LazyObject *)0x0;
  }
  else {
    this_01 = *(LazyObject **)(cVar23._M_node[2]._M_right + 1);
  }
  if ((pointer)local_398._0_8_ != pcVar2) {
    operator_delete((void *)local_398._0_8_);
  }
  if (this_01 == (LazyObject *)0x0) {
    local_398._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,"missing IfcProject entity","");
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_398);
    if ((pointer)local_398._0_8_ != pcVar2) {
      operator_delete((void *)local_398._0_8_);
    }
  }
  local_398._32_8_ = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProject>(this_01);
  local_258 = &this->settings;
  local_2b0._M_left = &local_2b0;
  local_398._0_8_ = (pointer)0x3ff0000000000000;
  local_398._8_8_ = -1.0;
  local_398._48_8_ = 1.0;
  local_398._56_8_ = 0.0;
  local_398._64_8_ = 0.0;
  local_398._72_8_ = 0.0;
  local_398._80_8_ = 0.0;
  local_398._88_8_ = 1.0;
  local_398._96_8_ = 0.0;
  local_398._104_8_ = 0.0;
  local_328 = 0.0;
  dStack_320 = 0.0;
  local_318 = 1.0;
  local_310 = 0.0;
  dStack_308 = 0.0;
  local_300 = (_func_int **)0x0;
  _Stack_2f8._M_w = 0;
  local_2f0 = 1.0;
  local_2b0._M_color = _S_red;
  local_2b0._M_parent = (_Base_ptr)0x0;
  local_2c8 = (pointer)0x0;
  ppaStack_2c0 = (pointer)0x0;
  local_2d8 = (pointer)0x0;
  ppaStack_2d0 = (pointer)0x0;
  local_2e8 = (pointer)0x0;
  ppaStack_2e0 = (pointer)0x0;
  local_290 = 0;
  local_280._M_left = &local_280;
  local_280._M_color = _S_red;
  local_280._M_parent = (_Base_ptr)0x0;
  local_260 = 0;
  local_238._M_left = &local_238;
  local_238._M_color = _S_red;
  local_238._M_parent = (_Base_ptr)0x0;
  local_250 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  pvStack_248 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  local_218 = 0;
  local_398._24_8_ = pDVar21;
  local_398._40_8_ = pScene;
  local_2b0._M_right = local_2b0._M_left;
  local_280._M_right = local_280._M_left;
  local_238._M_right = local_238._M_left;
  pIVar24 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                      ((((IfcProject *)local_398._32_8_)->UnitsInContext).obj);
  if (*(long *)&(pIVar24->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                field_0x18 !=
      *(long *)&(pIVar24->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                field_0x10) {
    lVar17 = 0;
    uVar45 = 0;
    do {
      pIVar24 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                          (((Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment> *)
                           (local_398._32_8_ + 0x148))->obj);
      anon_unknown.dwarf_d401fb::ConvertUnit
                (*(DataType **)
                  (*(long *)&(pIVar24->
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                             field_0x10 + lVar17),(ConversionData *)local_398);
      pIVar24 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                          (((Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment> *)
                           (local_398._32_8_ + 0x148))->obj);
      uVar45 = uVar45 + 1;
      lVar17 = lVar17 + 0x10;
    } while (uVar45 < (ulong)(*(long *)&(pIVar24->
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>
                                        ).field_0x18 -
                              *(long *)&(pIVar24->
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>
                                        ).field_0x10 >> 4));
  }
  pLVar43 = (((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_1UL,_0UL>
               *)(local_398._32_8_ + 0x130))->
            super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
            ).
            super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar4 = (((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_1UL,_0UL>
              *)(local_398._32_8_ + 0x130))->
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           ).
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar43 != pLVar4) {
    do {
      pIVar25 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentationContext>
                          (pLVar43->obj);
      if ((pIVar25->ContextType).have == true) {
        iVar15 = std::__cxx11::string::compare((char *)&pIVar25->ContextType);
        if (iVar15 == 0) break;
      }
      pLVar43 = pLVar43 + 1;
    } while (pLVar43 != pLVar4);
    lVar17 = __dynamic_cast((_func_int *)
                            ((long)&(pIVar25->
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                                    )._vptr_ObjectHelper +
                            (long)(pIVar25->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                                  )._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                            &Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::typeinfo,
                            0xffffffffffffffff);
    if (lVar17 != 0) {
      Assimp::IFC::ConvertAxisPlacement
                ((IfcMatrix4 *)(local_398 + 0x30),*(IfcAxis2Placement **)(lVar17 + 0x88),
                 (ConversionData *)local_398);
      LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4a71c6);
    }
  }
  uVar40 = local_398._24_8_;
  this_00 = (ObjectMapByType *)(local_398._24_8_ + 0x90);
  aStack_1c0._M_allocated_capacity._0_4_ = 0x73636669;
  aStack_1c0._M_local_buf[4] = 'i';
  aStack_1c0._M_allocated_capacity._5_2_ = 0x6574;
  fStack_1c8 = 9.80909e-45;
  fStack_1c4 = 0.0;
  aStack_1c0._7_4_ = aStack_1c0._7_4_ & 0xffffff00;
  _local_1d0 = (pointer)&aStack_1c0;
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                   *)this_00,(key_type *)local_1d0);
  if (cVar23._M_node == (_Base_ptr)(uVar40 + 0x98)) {
    __assert_fail("map.find(\"ifcsite\") != map.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCLoader.cpp"
                  ,0x374,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_1d0 != &aStack_1c0) {
    operator_delete(_local_1d0);
  }
  aStack_1c0._M_allocated_capacity._0_4_ = 0x73636669;
  aStack_1c0._M_local_buf[4] = 'i';
  aStack_1c0._M_allocated_capacity._5_2_ = 0x6574;
  fStack_1c8 = 9.80909e-45;
  fStack_1c4 = 0.0;
  aStack_1c0._7_4_ = aStack_1c0._7_4_ & 0xffffff00;
  _local_1d0 = (pointer)&aStack_1c0;
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                   *)this_00,(key_type *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_1d0 != &aStack_1c0) {
    operator_delete(_local_1d0);
  }
  if (cVar23._M_node[3]._M_parent == (_Base_ptr)0x0) {
    aStack_1c0._M_allocated_capacity._0_4_ = 0x62636669;
    aStack_1c0._M_local_buf[4] = 'u';
    aStack_1c0._M_allocated_capacity._5_2_ = 0x6c69;
    aStack_1c0._7_4_ = 0x676e6964;
    fStack_1c8 = 1.54143e-44;
    fStack_1c4 = 0.0;
    aStack_1c0._M_local_buf[0xb] = '\0';
    _local_1d0 = (pointer)&aStack_1c0;
    cVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                     *)this_00,(key_type *)local_1d0);
    if (cVar23._M_node == (_Base_ptr)(uVar40 + 0x98)) {
      __assert_fail("map.find(\"ifcbuilding\") != map.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCLoader.cpp"
                    ,0x378,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)")
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0);
    }
    aStack_1c0._M_allocated_capacity._0_4_ = 0x62636669;
    aStack_1c0._M_local_buf[4] = 'u';
    aStack_1c0._M_allocated_capacity._5_2_ = 0x6c69;
    aStack_1c0._7_4_ = 0x676e6964;
    fStack_1c8 = 1.54143e-44;
    fStack_1c4 = 0.0;
    aStack_1c0._M_local_buf[0xb] = '\0';
    _local_1d0 = (pointer)&aStack_1c0;
    cVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                     *)this_00,(key_type *)local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0);
    }
    if (cVar23._M_node[3]._M_parent == (_Base_ptr)0x0) {
      local_510._M_dataplus._M_p = (pointer)0x42;
      _local_1d0 = (pointer)&aStack_1c0;
      pvVar26 = (void *)std::__cxx11::string::_M_create((ulong *)local_1d0,(ulong)&local_510);
      _Var12._M_p = local_510._M_dataplus._M_p;
      local_1d0 = SUB84(pvVar26,0);
      fStack_1cc = (float)((ulong)pvVar26 >> 0x20);
      aStack_1c0._M_allocated_capacity._0_4_ = SUB84(local_510._M_dataplus._M_p,0);
      uVar13 = aStack_1c0._M_allocated_capacity._0_4_;
      aStack_1c0._M_local_buf[4] = (char)((ulong)local_510._M_dataplus._M_p >> 0x20);
      aStack_1c0._M_allocated_capacity._5_2_ =
           (undefined2)((ulong)local_510._M_dataplus._M_p >> 0x28);
      aStack_1c0._M_local_buf[7] = (char)((ulong)local_510._M_dataplus._M_p >> 0x38);
      memcpy(pvVar26,"no root element found (expected IfcBuilding or preferably IfcSite)",0x42);
      fStack_1c4 = (float)((ulong)_Var12._M_p >> 0x20);
      *(char *)((long)pvVar26 + (long)_Var12._M_p) = '\0';
      fStack_1c8 = (float)uVar13;
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1d0 != &aStack_1c0) {
        operator_delete(_local_1d0);
      }
    }
  }
  local_4e8 = (undefined8 *)0x0;
  iStack_4e0._M_current = (aiNode **)0x0;
  local_4d8 = (aiNode **)0x0;
  pIVar34 = (IFCImporter *)cVar23._M_node[2]._M_right;
  local_4a8 = (IFCImporter *)&cVar23._M_node[2]._M_parent;
  if (pIVar34 != local_4a8) {
    local_3d8 = cVar23._M_node;
    do {
      local_498 = pIVar34;
      pOVar27 = STEP::LazyObject::operator*
                          ((LazyObject *)
                           (pIVar34->super_BaseImporter).importerUnits._M_t._M_impl.
                           super__Rb_tree_header._M_header._M_left);
      paVar28 = (aiNode *)
                __dynamic_cast(pOVar27,&STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::typeinfo,
                               0xffffffffffffffff);
      _Var12._M_p = _local_1d0;
      if (paVar28 != (aiNode *)0x0) {
        if ((paVar28->mName).data[0x54] == '\x01') {
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          lVar17 = *(long *)((paVar28->mName).data + 0x34);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c8,lVar17,*(long *)((paVar28->mName).data + 0x3c) + lVar17);
        }
        else {
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          local_3c8.field_2._M_allocated_capacity._4_3_ = 0x64656d;
          local_3c8.field_2._M_allocated_capacity._0_4_ = 0x616e6e75;
          local_3c8._M_string_length = 7;
          local_3c8.field_2._M_local_buf[7] = '\0';
        }
        std::operator+(&local_1f0,"looking at spatial structure `",&local_3c8);
        paVar35 = &local_4c8.field_2;
        plVar22 = (long *)std::__cxx11::string::append((char *)&local_1f0);
        puVar38 = (ulong *)(plVar22 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar22 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar38) {
          local_4c8.field_2._M_allocated_capacity = *puVar38;
          local_4c8.field_2._8_8_ = plVar22[3];
          local_4c8._M_dataplus._M_p = (pointer)paVar35;
        }
        else {
          local_4c8.field_2._M_allocated_capacity = *puVar38;
          local_4c8._M_dataplus._M_p = (pointer)*plVar22;
        }
        local_4c8._M_string_length = plVar22[1];
        *plVar22 = (long)puVar38;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        if ((paVar28->mName).data[0xc4] == '\x01') {
          std::operator+(&local_3f8," which is of type ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((paVar28->mName).data + 0xa4));
        }
        else {
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          local_3f8._M_string_length = 0;
          local_3f8.field_2._M_local_buf[0] = '\0';
        }
        uVar40 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != paVar35) {
          uVar40 = local_4c8.field_2._M_allocated_capacity;
        }
        uVar45 = (long)&(((_Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                           *)local_4c8._M_string_length)->_M_impl).super__Vector_impl_data._M_start
                 + local_3f8._M_string_length;
        ppcVar42 = (char **)local_4c8._M_string_length;
        if ((ulong)uVar40 < uVar45) {
          uVar41 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            uVar41 = CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                              local_3f8.field_2._M_local_buf[0]);
          }
          if (uVar41 < uVar45) goto LAB_004a7587;
          puVar29 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_3f8,0,(char *)0x0,(ulong)local_4c8._M_dataplus._M_p);
        }
        else {
LAB_004a7587:
          puVar29 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_4c8,(ulong)local_3f8._M_dataplus._M_p);
        }
        psVar1 = puVar29 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar29 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_510.field_2._M_allocated_capacity = *psVar1;
          local_510.field_2._8_8_ = puVar29[3];
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        }
        else {
          local_510.field_2._M_allocated_capacity = *psVar1;
          local_510._M_dataplus._M_p = (pointer)*puVar29;
        }
        local_510._M_string_length = puVar29[1];
        *puVar29 = psVar1;
        puVar29[1] = 0;
        *(undefined1 *)psVar1 = 0;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1d0,
                   &local_510);
        LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != paVar35) {
          operator_delete(local_4c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        uVar40 = *(undefined8 *)
                  (&((IfcObject *)local_398._32_8_)->field_0x8 +
                  *(long *)(*(long *)(IfcObject *)local_398._32_8_ + -0x18));
        local_1d0 = SUB84(uVar40,0);
        fStack_1cc = (float)((ulong)uVar40 >> 0x20);
        pVar71 = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)(local_398._24_8_ + 0xc0),(key_type_conflict1 *)local_1d0);
        _Var12._M_p = (pointer)CONCAT44(fStack_1cc,local_1d0);
        _Var33 = pVar71.first._M_node;
        while (_Var33._M_node != pVar71.second._M_node._M_node) {
          p_Var39 = (((DB *)local_398._24_8_)->objects)._M_t._M_impl.super__Rb_tree_header._M_header
                    ._M_parent;
          p_Var30 = &(((DB *)local_398._24_8_)->objects)._M_t._M_impl.super__Rb_tree_header.
                     _M_header;
          do {
            bVar14 = *(_Base_ptr *)(p_Var39 + 1) < _Var33._M_node[1]._M_parent;
            if (!bVar14) {
              p_Var30 = p_Var39;
            }
            p_Var39 = (&p_Var39->_M_left)[bVar14];
          } while (p_Var39 != (_Base_ptr)0x0);
          pOVar27 = STEP::LazyObject::operator*((LazyObject *)p_Var30[1]._M_parent);
          lVar17 = __dynamic_cast(pOVar27,&STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelAggregates::typeinfo,
                                  0xffffffffffffffff);
          if (lVar17 != 0) {
            puVar5 = *(undefined8 **)(lVar17 + 0xb8);
            for (puVar29 = *(undefined8 **)(lVar17 + 0xb0); puVar29 != puVar5; puVar29 = puVar29 + 1
                ) {
              pIVar31 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  ((LazyObject *)*puVar29);
              if (*(long *)((long)&(pIVar31->super_IfcRoot).
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                   aux_is_derived.super__Base_bitset<1UL>._M_w +
                           (long)(pIVar31->super_IfcRoot).
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                 _vptr_ObjectHelper[-3]) ==
                  *(long *)((paVar28->mName).data + *(long *)(*(long *)&paVar28->mName + -0x18) + 4)
                 ) {
                LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4a7766);
                paVar32 = anon_unknown.dwarf_d401fb::ProcessSpatialStructure
                                    ((anon_unknown_dwarf_d401fb *)0x0,paVar28,
                                     (IfcProduct *)local_398,(ConversionData *)0x0,
                                     (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      *)ppcVar42);
                local_1d0 = SUB84(paVar32,0);
                fStack_1cc = (float)((ulong)paVar32 >> 0x20);
                if (iStack_4e0._M_current == local_4d8) {
                  std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                            ((vector<aiNode*,std::allocator<aiNode*>> *)&local_4e8,iStack_4e0,
                             (aiNode **)local_1d0);
                }
                else {
                  *iStack_4e0._M_current = paVar32;
                  iStack_4e0._M_current = iStack_4e0._M_current + 1;
                }
              }
            }
          }
          _Var33._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var33._M_node);
          _Var12._M_p = (pointer)CONCAT44(fStack_1cc,local_1d0);
        }
      }
      _local_1d0 = _Var12._M_p;
      pIVar34 = (IFCImporter *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_498);
    } while (pIVar34 != local_4a8);
    lVar17 = (long)iStack_4e0._M_current - (long)local_4e8;
    cVar23._M_node = local_3d8;
    if (lVar17 != 0) goto LAB_004a78c5;
  }
  LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4a780a);
  pIVar34 = (IFCImporter *)cVar23._M_node[2]._M_right;
  if (pIVar34 != local_4a8) {
    do {
      pOVar27 = STEP::LazyObject::operator*
                          ((LazyObject *)
                           (pIVar34->super_BaseImporter).importerUnits._M_t._M_impl.
                           super__Rb_tree_header._M_header._M_left);
      paVar28 = (aiNode *)
                __dynamic_cast(pOVar27,&STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::typeinfo);
      if (paVar28 != (aiNode *)0x0) {
        paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)anon_unknown.dwarf_d401fb::ProcessSpatialStructure
                               ((anon_unknown_dwarf_d401fb *)0x0,paVar28,(IfcProduct *)local_398,
                                (ConversionData *)0x0,
                                (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                 *)ppcVar42);
        _local_1d0 = (pointer)paVar35;
        if (iStack_4e0._M_current == local_4d8) {
          std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                    ((vector<aiNode*,std::allocator<aiNode*>> *)&local_4e8,iStack_4e0,
                     (aiNode **)local_1d0);
        }
        else {
          *iStack_4e0._M_current = (aiNode *)paVar35;
          iStack_4e0._M_current = iStack_4e0._M_current + 1;
        }
      }
      pIVar34 = (IFCImporter *)std::_Rb_tree_increment((_Rb_tree_node_base *)pIVar34);
    } while (pIVar34 != local_4a8);
  }
  lVar17 = (long)iStack_4e0._M_current - (long)local_4e8;
LAB_004a78c5:
  lVar18 = lVar17 >> 3;
  if (lVar18 == 0) {
    local_510._M_dataplus._M_p = (pointer)0x28;
    _local_1d0 = (pointer)&aStack_1c0;
    pcVar36 = (char *)std::__cxx11::string::_M_create((ulong *)local_1d0,(ulong)&local_510);
    local_1d0 = SUB84(pcVar36,0);
    fStack_1cc = (float)((ulong)pcVar36 >> 0x20);
    aStack_1c0._M_allocated_capacity._0_4_ = SUB84(local_510._M_dataplus._M_p,0);
    aStack_1c0._M_local_buf[4] = (char)((ulong)local_510._M_dataplus._M_p >> 0x20);
    aStack_1c0._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_510._M_dataplus._M_p >> 0x28)
    ;
    aStack_1c0._M_local_buf[7] = (char)((ulong)local_510._M_dataplus._M_p >> 0x38);
    builtin_strncpy(pcVar36,"failed to determine primary site element",0x28);
    fStack_1c4 = (float)((ulong)local_510._M_dataplus._M_p >> 0x20);
    pcVar36[(long)local_510._M_dataplus._M_p] = '\0';
    fStack_1c8 = (float)aStack_1c0._M_allocated_capacity._0_4_;
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0);
    }
  }
  else if (lVar18 == 1) {
    *(aiNode **)(local_398._40_8_ + 8) = (aiNode *)*local_4e8;
  }
  else {
    paVar28 = (aiNode *)operator_new(0x478);
    aStack_1c0._M_allocated_capacity._0_4_ = 0x746f6f52;
    fStack_1c8 = 5.60519e-45;
    fStack_1c4 = 0.0;
    aStack_1c0._M_local_buf[4] = '\0';
    _local_1d0 = (pointer)&aStack_1c0;
    aiNode::aiNode(paVar28,(string *)local_1d0);
    *(aiNode **)(local_398._40_8_ + 8) = paVar28;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1d0 != &aStack_1c0) {
      operator_delete(_local_1d0);
    }
    (*(aiNode **)(local_398._40_8_ + 8))->mParent = (aiNode *)0x0;
    (*(aiNode **)(local_398._40_8_ + 8))->mNumChildren = (uint)lVar18;
    paVar28 = *(aiNode **)(local_398._40_8_ + 8);
    ppaVar37 = (aiNode **)operator_new__((ulong)paVar28->mNumChildren << 3);
    paVar28->mChildren = ppaVar37;
    if (lVar17 != 0) {
      lVar17 = 0;
      do {
        paVar28 = (aiNode *)local_4e8[lVar17];
        paVar32 = *(aiNode **)(local_398._40_8_ + 8);
        paVar28->mParent = paVar32;
        paVar32->mChildren[lVar17] = paVar28;
        lVar17 = lVar17 + 1;
      } while (lVar18 + (ulong)(lVar18 == 0) != lVar17);
    }
  }
  if (local_4e8 != (undefined8 *)0x0) {
    operator_delete(local_4e8);
  }
  local_1d0 = (undefined1  [4])0x3f800000;
  fStack_1cc = 0.0;
  fStack_1c8 = 0.0;
  fStack_1c4 = 0.0;
  aStack_1c0._M_allocated_capacity._0_4_ = 0;
  aStack_1c0._M_local_buf[4] = '\0';
  aStack_1c0._M_allocated_capacity._5_2_ = 0x8000;
  aStack_1c0._7_4_ = 0x3f;
  aStack_1c0._M_local_buf[0xb] = '\0';
  aStack_1c0._12_4_ = 0;
  uStack_1b0 = 0;
  local_1a8 = 1.0;
  local_1a4 = 0;
  fStack_19c = 0.0;
  fStack_198 = 0.0;
  fStack_194 = 1.0;
  anon_unknown.dwarf_d401fb::MakeTreeRelative
            (*(aiNode **)(local_398._40_8_ + 8),(aiMatrix4x4 *)local_1d0);
  __src = local_2e8;
  uVar45 = (long)ppaStack_2e0 - (long)local_2e8;
  if (uVar45 != 0) {
    local_4f0->mNumMeshes = (uint)(uVar45 >> 3);
    __s = (aiMesh **)operator_new__(uVar45 & 0x7fffffff8);
    memset(__s,0,uVar45 & 0x7fffffff8);
    local_4f0->mMeshes = __s;
    memmove(__s,__src,uVar45);
    ppaStack_2e0 = __src;
  }
  __src_00 = ppaStack_2d0;
  uVar45 = (long)local_2c8 - (long)ppaStack_2d0;
  paVar44 = local_4f0;
  if (uVar45 != 0) {
    local_4f0->mNumMaterials = (uint)(uVar45 >> 3);
    __s_00 = (aiMaterial **)operator_new__(uVar45 & 0x7fffffff8);
    memset(__s_00,0,uVar45 & 0x7fffffff8);
    paVar44 = local_4f0;
    local_4f0->mMaterials = __s_00;
    memmove(__s_00,__src_00,uVar45);
    local_2c8 = __src_00;
  }
  fVar56 = (float)(double)local_398._0_8_;
  local_43c = 0.0 - fVar56;
  fVar60 = (float)(double)local_398._48_8_;
  fVar54 = (float)(double)local_398._56_8_;
  local_470 = (float)(double)local_398._80_8_;
  fVar66 = fVar56 + 0.0;
  local_448 = (float)(double)local_398._88_8_;
  fVar51 = (float)local_328;
  local_46c = fVar56 * 0.0 + 0.0;
  local_48 = (float)dStack_320;
  fVar57 = fVar56 * -4.371139e-08 + 0.0;
  local_454 = fVar60 * local_46c;
  local_44c = fVar54 * local_46c;
  fVar64 = (float)(double)local_398._64_8_;
  local_440 = (float)(double)local_398._96_8_;
  local_444 = fVar64 * local_46c;
  fVar70 = (float)local_318;
  fVar62 = local_46c + 0.0;
  local_468 = fVar51 * fVar62;
  local_460 = local_48 * fVar62;
  local_45c = fVar70 * fVar62;
  local_474 = (float)local_310;
  local_450 = local_474 * fVar62;
  fVar56 = (float)(double)local_398._72_8_;
  local_478 = local_46c * fVar56;
  local_58 = fVar54 * fVar62;
  local_47c = (float)(double)local_398._104_8_;
  fVar68 = fVar57 + 0.0;
  fVar52 = fVar60 * fVar62 + local_46c * local_470 + local_468 + (float)dStack_308;
  local_4a8 = (IFCImporter *)CONCAT44(in_XMM7_Db,fVar52);
  local_208 = (float)dStack_308 * 0.0;
  fVar53 = fVar60 * fVar66 + local_46c * local_470 + local_468 + local_208;
  fVar46 = fVar51 * fVar66 + fVar57 * local_470 + local_454 + local_208;
  local_3d8 = (_Base_ptr)CONCAT44(in_XMM2_Db,fVar46);
  local_208 = fVar51 * fVar68 + local_470 * local_43c + local_454 + local_208;
  fVar47 = local_58 + local_46c * local_448 + local_460 + (float)(double)local_300;
  fVar58 = (float)(double)local_300 * 0.0;
  fVar61 = fVar54 * fVar66 + local_46c * local_448 + local_460 + fVar58;
  fVar48 = local_48 * fVar66 + fVar57 * local_448 + local_44c + fVar58;
  local_498 = (IFCImporter *)CONCAT44(in_XMM9_Db,fVar48);
  fVar58 = local_48 * fVar68 + local_448 * local_43c + local_44c + fVar58;
  fVar65 = fVar64 * fVar62 + local_46c * local_440 + local_45c + (float)(double)_Stack_2f8._M_w;
  fVar59 = (float)(double)_Stack_2f8._M_w * 0.0;
  fVar55 = fVar64 * fVar66 + local_46c * local_440 + local_45c + fVar59;
  fVar69 = fVar70 * fVar66 + fVar57 * local_440 + local_444 + fVar59;
  fVar59 = fVar70 * fVar68 + local_440 * local_43c + local_444 + fVar59;
  fVar49 = (float)local_2f0 * 0.0;
  fVar50 = fVar56 * fVar66 + local_46c * local_47c + local_450 + fVar49;
  fVar67 = fVar66 * local_474 + fVar57 * local_47c + local_478 + fVar49;
  fVar49 = fVar68 * local_474 + local_43c * local_47c + local_478 + fVar49;
  fVar63 = fVar62 * fVar56 + local_46c * local_47c + local_450 + (float)local_2f0;
  paVar28 = paVar44->mRootNode;
  fVar56 = (paVar28->mTransformation).b1;
  fVar51 = (paVar28->mTransformation).b2;
  fVar54 = (paVar28->mTransformation).b3;
  fVar57 = (paVar28->mTransformation).b4;
  fVar60 = (paVar28->mTransformation).a1;
  fVar62 = (paVar28->mTransformation).a2;
  fVar64 = (paVar28->mTransformation).a3;
  fVar66 = (paVar28->mTransformation).a4;
  fVar68 = (paVar28->mTransformation).c1;
  fVar70 = (paVar28->mTransformation).c2;
  fVar6 = (paVar28->mTransformation).c3;
  fVar7 = (paVar28->mTransformation).c4;
  fVar8 = (paVar28->mTransformation).d1;
  fVar9 = (paVar28->mTransformation).d2;
  fVar10 = (paVar28->mTransformation).d3;
  fVar11 = (paVar28->mTransformation).d4;
  (paVar28->mTransformation).a1 =
       fVar50 * fVar8 + fVar55 * fVar68 + fVar53 * fVar60 + fVar61 * fVar56;
  (paVar28->mTransformation).a2 =
       fVar50 * fVar9 + fVar55 * fVar70 + fVar53 * fVar62 + fVar61 * fVar51;
  (paVar28->mTransformation).a3 =
       fVar50 * fVar10 + fVar55 * fVar6 + fVar53 * fVar64 + fVar61 * fVar54;
  (paVar28->mTransformation).a4 =
       fVar50 * fVar11 + fVar55 * fVar7 + fVar53 * fVar66 + fVar61 * fVar57;
  (paVar28->mTransformation).b1 =
       fVar67 * fVar8 + fVar69 * fVar68 + fVar46 * fVar60 + fVar48 * fVar56;
  (paVar28->mTransformation).b2 =
       fVar67 * fVar9 + fVar69 * fVar70 + fVar46 * fVar62 + fVar48 * fVar51;
  (paVar28->mTransformation).b3 =
       fVar67 * fVar10 + fVar69 * fVar6 + fVar46 * fVar64 + fVar48 * fVar54;
  (paVar28->mTransformation).b4 =
       fVar67 * fVar11 + fVar69 * fVar7 + fVar46 * fVar66 + fVar48 * fVar57;
  (paVar28->mTransformation).c1 =
       fVar49 * fVar8 + fVar59 * fVar68 + local_208 * fVar60 + fVar58 * fVar56;
  (paVar28->mTransformation).c2 =
       fVar49 * fVar9 + fVar59 * fVar70 + local_208 * fVar62 + fVar58 * fVar51;
  (paVar28->mTransformation).c3 =
       fVar49 * fVar10 + fVar59 * fVar6 + local_208 * fVar64 + fVar58 * fVar54;
  (paVar28->mTransformation).c4 =
       fVar49 * fVar11 + fVar59 * fVar7 + local_208 * fVar66 + fVar58 * fVar57;
  (paVar28->mTransformation).d1 =
       fVar63 * fVar8 + fVar65 * fVar68 + fVar52 * fVar60 + fVar47 * fVar56;
  (paVar28->mTransformation).d2 =
       fVar63 * fVar9 + fVar65 * fVar70 + fVar52 * fVar62 + fVar47 * fVar51;
  (paVar28->mTransformation).d3 =
       fVar63 * fVar10 + fVar65 * fVar6 + fVar52 * fVar64 + fVar47 * fVar54;
  (paVar28->mTransformation).d4 =
       fVar63 * fVar11 + fVar65 * fVar7 + fVar52 * fVar66 + fVar47 * fVar57;
  local_464 = local_46c;
  local_458 = local_46c;
  bVar14 = DefaultLogger::isNullLogger();
  pDVar21 = local_488;
  if (!bVar14) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"STEP: evaluated ",0x10)
    ;
    pDVar21 = local_488;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0," object records",0xf);
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    std::ios_base::~ios_base(local_160);
  }
  Assimp::IFC::ConversionData::~ConversionData((ConversionData *)local_398);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
               *)local_438);
  if (pDVar21 != (DB *)0x0) {
    STEP::DB::~DB(pDVar21);
    operator_delete(pDVar21);
  }
  if (local_408._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_refcount._M_pi);
  }
  return;
}

Assistant:

void IFCImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::shared_ptr<IOStream> stream(pIOHandler->Open(pFile));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }


    // if this is a ifczip file, decompress its contents first
    if(GetExtension(pFile) == "ifczip") {
#ifndef ASSIMP_BUILD_NO_COMPRESSED_IFC
        unzFile zip = unzOpen( pFile.c_str() );
        if(zip == NULL) {
            ThrowException("Could not open ifczip file for reading, unzip failed");
        }

        // chop 'zip' postfix
        std::string fileName = pFile.substr(0,pFile.length() - 3);

        std::string::size_type s = pFile.find_last_of('\\');
        if(s == std::string::npos) {
            s = pFile.find_last_of('/');
        }
        if(s != std::string::npos) {
            fileName = fileName.substr(s+1);
        }

        // search file (same name as the IFCZIP except for the file extension) and place file pointer there
        if(UNZ_OK == unzGoToFirstFile(zip)) {
            do {
                // get file size, etc.
                unz_file_info fileInfo;
                char filename[256];
                unzGetCurrentFileInfo( zip , &fileInfo, filename, sizeof(filename), 0, 0, 0, 0 );
                if (GetExtension(filename) != "ifc") {
                    continue;
                }
                uint8_t* buff = new uint8_t[fileInfo.uncompressed_size];
                LogInfo("Decompressing IFCZIP file");
                unzOpenCurrentFile(zip);
                size_t total = 0;
                int read = 0;
                do {
                    int bufferSize = fileInfo.uncompressed_size < INT16_MAX ? fileInfo.uncompressed_size : INT16_MAX;
                    void* buffer = malloc(bufferSize);
                    read = unzReadCurrentFile(zip, buffer, bufferSize);
                    if (read > 0) {
                        memcpy((char*)buff + total, buffer, read);
                        total += read;
                    }
                    free(buffer);
                } while (read > 0);
                size_t filesize = fileInfo.uncompressed_size;
                if (total == 0 || size_t(total) != filesize)
                {
                    delete[] buff;
                    ThrowException("Failed to decompress IFC ZIP file");
                }
                unzCloseCurrentFile( zip );
                stream.reset(new MemoryIOStream(buff,fileInfo.uncompressed_size,true));
                break;

                if (unzGoToNextFile(zip) == UNZ_END_OF_LIST_OF_FILE) {
                    ThrowException("Found no IFC file member in IFCZIP file (1)");
                }

            } while(true);
        }
        else {
            ThrowException("Found no IFC file member in IFCZIP file (2)");
        }

        unzClose(zip);
#else
        ThrowException("Could not open ifczip file for reading, assimp was built without ifczip support");
#endif
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(stream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();

    if(!head.fileSchema.size() || head.fileSchema.substr(0,3) != "IFC") {
        ThrowException("Unrecognized file schema: " + head.fileSchema);
    }

    if (!DefaultLogger::isNullLogger()) {
        LogDebug("File schema is \'" + head.fileSchema + '\'');
        if (head.timestamp.length()) {
            LogDebug("Timestamp \'" + head.timestamp + '\'');
        }
        if (head.app.length()) {
            LogDebug("Application/Exporter identline is \'" + head.app  + '\'');
        }
    }

    // obtain a copy of the machine-generated IFC scheme
    ::Assimp::STEP::EXPRESS::ConversionSchema schema;
    Schema_2x3::GetSchema(schema);

    // tell the reader which entity types to track with special care
    static const char* const types_to_track[] = {
        "ifcsite", "ifcbuilding", "ifcproject"
    };

    // tell the reader for which types we need to simulate STEPs reverse indices
    static const char* const inverse_indices_to_track[] = {
        "ifcrelcontainedinspatialstructure", "ifcrelaggregates", "ifcrelvoidselement", "ifcreldefinesbyproperties", "ifcpropertyset", "ifcstyleditem"
    };

    // feed the IFC schema into the reader and pre-parse all lines
    STEP::ReadFile(*db, schema, types_to_track, inverse_indices_to_track);
    const STEP::LazyObject* proj =  db->GetObject("ifcproject");
    if (!proj) {
        ThrowException("missing IfcProject entity");
    }

    ConversionData conv(*db,proj->To<Schema_2x3::IfcProject>(),pScene,settings);
    SetUnits(conv);
    SetCoordinateSpace(conv);
    ProcessSpatialStructures(conv);
    MakeTreeRelative(conv);

    // NOTE - this is a stress test for the importer, but it works only
    // in a build with no entities disabled. See
    //     scripts/IFCImporter/CPPGenerator.py
    // for more information.
    #ifdef ASSIMP_IFC_TEST
        db->EvaluateAll();
    #endif

    // do final data copying
    if (conv.meshes.size()) {
        pScene->mNumMeshes = static_cast<unsigned int>(conv.meshes.size());
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes]();
        std::copy(conv.meshes.begin(),conv.meshes.end(),pScene->mMeshes);

        // needed to keep the d'tor from burning us
        conv.meshes.clear();
    }

    if (conv.materials.size()) {
        pScene->mNumMaterials = static_cast<unsigned int>(conv.materials.size());
        pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials]();
        std::copy(conv.materials.begin(),conv.materials.end(),pScene->mMaterials);

        // needed to keep the d'tor from burning us
        conv.materials.clear();
    }

    // apply world coordinate system (which includes the scaling to convert to meters and a -90 degrees rotation around x)
    aiMatrix4x4 scale, rot;
    aiMatrix4x4::Scaling(static_cast<aiVector3D>(IfcVector3(conv.len_scale)),scale);
    aiMatrix4x4::RotationX(-AI_MATH_HALF_PI_F,rot);

    pScene->mRootNode->mTransformation = rot * scale * conv.wcs * pScene->mRootNode->mTransformation;

    // this must be last because objects are evaluated lazily as we process them
    if ( !DefaultLogger::isNullLogger() ){
        LogDebug((Formatter::format(),"STEP: evaluated ",db->GetEvaluatedObjectCount()," object records"));
    }
}